

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

bool __thiscall
pstore::romfs::directory::check
          (directory *this,not_null<const_pstore::romfs::directory_*> parent,
          check_stack_entry *visited)

{
  pointer this_00;
  bool bVar1;
  iterator iVar2;
  value_type *pvVar3;
  const_reference ptVar4;
  directory *this_01;
  byte local_e9;
  not_null<const_pstore::romfs::directory_*> local_c8;
  undefined1 local_c0 [8];
  check_stack_entry me;
  error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> od;
  dirent *de;
  iterator __end2;
  iterator __begin2;
  directory *__range2;
  not_null<const_directory_*> local_70;
  pointer_based_iterator<const_pstore::romfs::dirent> local_68;
  iterator dot_dot;
  iterator dot;
  directory *local_40;
  pointer local_38;
  check_stack_entry *v;
  iterator end;
  check_stack_entry *visited_local;
  directory *this_local;
  not_null<const_pstore::romfs::directory_*> parent_local;
  
  end.pos_ = (pointer)visited;
  this_local = parent.ptr_;
  v = (check_stack_entry *)directory::end(this);
  for (local_38 = end.pos_; this_00 = local_38, local_38 != (pointer)0x0;
      local_38 = (pointer)(local_38->contents_).ptr_) {
    local_40 = pstore::gsl::not_null::operator_cast_to_directory_((not_null *)&this_local);
    bVar1 = pstore::gsl::not_null<const_pstore::romfs::directory_*>::operator==
                      ((not_null<const_pstore::romfs::directory_*> *)this_00,&local_40);
    if (bVar1) {
      parent_local.ptr_._7_1_ = 1;
      goto LAB_00156bfd;
    }
  }
  iVar2 = begin(this);
  bVar1 = std::
          is_sorted<pstore::pointer_based_iterator<pstore::romfs::dirent_const>,pstore::romfs::directory::check(pstore::gsl::not_null<pstore::romfs::directory_const*>,pstore::romfs::directory::check_stack_entry_const*)const::__0>
                    (iVar2.pos_,v);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    dot_dot = find<2ul>(this,(char (*) [2])0x165693);
    local_68.pos_ = (pointer)find<3ul>(this,(char (*) [3])"..");
    bVar1 = pointer_based_iterator<pstore::romfs::dirent_const>::operator==
                      ((pointer_based_iterator<pstore::romfs::dirent_const> *)&dot_dot,
                       (pointer_based_iterator<const_pstore::romfs::dirent> *)&v);
    if ((bVar1) ||
       (bVar1 = pointer_based_iterator<pstore::romfs::dirent_const>::operator==
                          ((pointer_based_iterator<pstore::romfs::dirent_const> *)&local_68,
                           (pointer_based_iterator<const_pstore::romfs::dirent> *)&v), bVar1)) {
      parent_local.ptr_._7_1_ = 0;
    }
    else {
      pvVar3 = pointer_based_iterator<const_pstore::romfs::dirent>::operator*(&dot_dot);
      pstore::gsl::not_null<const_pstore::romfs::directory_*>::not_null(&local_70,this);
      bVar1 = anon_unknown.dwarf_baca8::is_expected_dir(pvVar3,local_70);
      local_e9 = 1;
      if (bVar1) {
        pvVar3 = pointer_based_iterator<const_pstore::romfs::dirent>::operator*(&local_68);
        bVar1 = anon_unknown.dwarf_baca8::is_expected_dir
                          (pvVar3,(not_null<const_directory_*>)this_local);
        local_e9 = bVar1 ^ 0xff;
      }
      if ((local_e9 & 1) == 0) {
        __end2 = begin(this);
        de = (dirent *)directory::end(this);
        while (bVar1 = pointer_based_iterator<pstore::romfs::dirent_const>::operator!=
                                 ((pointer_based_iterator<pstore::romfs::dirent_const> *)&__end2,
                                  (pointer_based_iterator<const_pstore::romfs::dirent> *)&de), bVar1
              ) {
          pvVar3 = pointer_based_iterator<const_pstore::romfs::dirent>::operator*(&__end2);
          bVar1 = dirent::is_directory(pvVar3);
          if (bVar1) {
            dirent::opendir((dirent *)&me.prev,(char *)pvVar3);
            bVar1 = pstore::error_or::operator_cast_to_bool((error_or *)&me.prev);
            if (bVar1) {
              ptVar4 = error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::operator*
                                 ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>
                                   *)&me.prev);
              local_c0 = (undefined1  [8])ptVar4->ptr_;
              me.d.ptr_ = (directory *)end.pos_;
              ptVar4 = error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::operator*
                                 ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>
                                   *)&me.prev);
              this_01 = pstore::gsl::not_null<const_pstore::romfs::directory_*>::operator->(ptVar4);
              pstore::gsl::not_null<const_pstore::romfs::directory_*>::not_null(&local_c8,this);
              bVar1 = check(this_01,local_c8,(check_stack_entry *)local_c0);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                bVar1 = false;
              }
              else {
                parent_local.ptr_._7_1_ = 0;
                bVar1 = true;
              }
            }
            else {
              parent_local.ptr_._7_1_ = 0;
              bVar1 = true;
            }
            error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::~error_or
                      ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                       &me.prev);
            if (bVar1) goto LAB_00156bfd;
          }
          pointer_based_iterator<const_pstore::romfs::dirent>::operator++(&__end2);
        }
        parent_local.ptr_._7_1_ = 1;
      }
      else {
        parent_local.ptr_._7_1_ = 0;
      }
    }
  }
  else {
    parent_local.ptr_._7_1_ = 0;
  }
LAB_00156bfd:
  return (bool)(parent_local.ptr_._7_1_ & 1);
}

Assistant:

bool directory::check (gsl::not_null<directory const *> const parent,
                               check_stack_entry const * const visited) const {
            auto const end = this->end ();

            // This stops us from looping forever if we follow a directory pointer to a directory
            // that we have already visited.
            for (auto const * v = visited; v != nullptr; v = v->prev) {
                if (v->d == parent) {
                    return true;
                }
            }

            // Check that the directory entries are sorted by name.
            if (!std::is_sorted (begin (), end, [] (dirent const & a, dirent const & b) {
                    return std::strcmp (a.name (), b.name ()) < 0;
                })) {
                return false;
            }

            // Look for the '.' and '..' entries and check that they point where we expect.
            iterator const dot = this->find (".");
            iterator const dot_dot = this->find ("..");
            if (dot == end || dot_dot == end) {
                return false;
            }
            if (!is_expected_dir (*dot, this) || !is_expected_dir (*dot_dot, parent)) {
                return false;
            }

            // Recursively check any directories contained by this one.
            for (dirent const & de : *this) {
                if (de.is_directory ()) {
                    if (auto const od = de.opendir ()) {
                        check_stack_entry const me{*od, visited};
                        if (!(*od)->check (this, &me)) {
                            // Error: recursive check failed.
                            return false;
                        }
                    } else {
                        // Error: this entry claimed to be a directory but opendir() failed.
                        return false;
                    }
                }
            }

            return true;
        }